

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d8.cpp
# Opt level: O2

Texture * rw::d3d8::readNativeTexture(Stream *stream)

{
  int iVar1;
  bool bVar2;
  byte bVar3;
  byte bVar4;
  uint16 uVar5;
  uint32 uVar6;
  int32 iVar7;
  uint height;
  uint depth;
  Texture *pTVar8;
  Raster *pRVar9;
  uint8 *puVar10;
  char *pcVar11;
  int iVar12;
  uint numLevels;
  int32 i;
  uint uVar13;
  long lVar14;
  long lVar15;
  FILE *__stream;
  uint format;
  Error _e;
  
  bVar2 = findChunk(stream,1,(uint32 *)0x0,(uint32 *)0x0);
  if (!bVar2) {
    _e.plugin = 2;
    _e.code = 0x80000004;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/d3d/d3d8.cpp",0x217);
    __stream = _stderr;
    pcVar11 = dbgsprint(0x80000004,"STRUCT");
LAB_00110d0b:
    fprintf(__stream,"%s\n",pcVar11);
    setError(&_e);
    return (Texture *)0x0;
  }
  uVar6 = Stream::readU32(stream);
  if (uVar6 != 8) {
    _e.plugin = 2;
    _e.code = 0x80000006;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/d3d/d3d8.cpp",0x21c);
    __stream = _stderr;
    pcVar11 = dbgsprint(0x80000006,(ulong)uVar6);
    goto LAB_00110d0b;
  }
  pTVar8 = Texture::create((Raster *)0x0);
  if (pTVar8 == (Texture *)0x0) {
    return (Texture *)0x0;
  }
  uVar6 = Stream::readU32(stream);
  pTVar8->filterAddressing = uVar6;
  (*stream->_vptr_Stream[4])(stream,pTVar8->name,0x20);
  (*stream->_vptr_Stream[4])(stream,pTVar8->mask,0x20);
  uVar6 = Stream::readU32(stream);
  iVar7 = Stream::readI32(stream);
  uVar5 = Stream::readU16(stream);
  uVar13 = (uint)uVar5;
  uVar5 = Stream::readU16(stream);
  height = (uint)uVar5;
  bVar3 = Stream::readU8(stream);
  depth = (uint)bVar3;
  bVar3 = Stream::readU8(stream);
  numLevels = (uint)bVar3;
  bVar3 = Stream::readU8(stream);
  bVar4 = Stream::readU8(stream);
  iVar1 = 0x20;
  if ((uVar6 >> 0xe & 1) == 0) {
    iVar12 = 0;
    iVar1 = 0x100;
    if ((uVar6 >> 0xd & 1) == 0) goto LAB_00110b33;
  }
  iVar12 = iVar1;
  if (d3d::isP8supported == 0) {
    pRVar9 = readAsImage(stream,uVar13,height,depth,uVar6 | bVar3,numLevels);
    pTVar8->raster = pRVar9;
    return pTVar8;
  }
LAB_00110b33:
  format = uVar6 | bVar3;
  if (bVar4 == 0) {
    pRVar9 = Raster::create(uVar13,height,depth,format,8);
    lVar14 = (long)&pRVar9->platform + (long)d3d::nativeRasterOffset;
  }
  else {
    pRVar9 = Raster::create(uVar13,height,depth,format | 0x80,8);
    lVar15 = (long)d3d::nativeRasterOffset;
    lVar14 = (long)&pRVar9->platform + lVar15;
    d3d::allocateDXT(pRVar9,(uint)bVar4,numLevels,iVar7);
    *(undefined1 *)((long)&pRVar9->stride + lVar15 + 1) = 1;
  }
  pTVar8->raster = pRVar9;
  if (iVar12 != 0) {
    (*stream->_vptr_Stream[4])(stream,*(undefined8 *)(lVar14 + 8),(ulong)(uint)(iVar12 << 2));
  }
  for (uVar13 = 0; numLevels != uVar13; uVar13 = uVar13 + 1) {
    uVar6 = Stream::readU32(stream);
    iVar7 = Raster::getNumLevels(pRVar9);
    if ((int)uVar13 < iVar7) {
      puVar10 = Raster::lock(pRVar9,uVar13,5);
      (*stream->_vptr_Stream[4])(stream,puVar10,(ulong)uVar6);
      Raster::unlock(pRVar9,uVar13);
    }
    else {
      (*stream->_vptr_Stream[5])(stream,(ulong)uVar6,1);
    }
  }
  return pTVar8;
}

Assistant:

Texture*
readNativeTexture(Stream *stream)
{
	uint32 platform;
	if(!findChunk(stream, ID_STRUCT, nil, nil)){
		RWERROR((ERR_CHUNK, "STRUCT"));
		return nil;
	}
	platform = stream->readU32();
	if(platform != PLATFORM_D3D8){
		RWERROR((ERR_PLATFORM, platform));
		return nil;
	}
	Texture *tex = Texture::create(nil);
	if(tex == nil)
		return nil;

	// Texture
	tex->filterAddressing = stream->readU32();
	stream->read8(tex->name, 32);
	stream->read8(tex->mask, 32);

	// Raster
	uint32 format = stream->readU32();
	bool32 hasAlpha = stream->readI32();
	int32 width = stream->readU16();
	int32 height = stream->readU16();
	int32 depth = stream->readU8();
	int32 numLevels = stream->readU8();
	int32 type = stream->readU8();
	int32 compression = stream->readU8();

	int32 pallength = 0;
	if(format & Raster::PAL4 || format & Raster::PAL8){
		pallength = format & Raster::PAL4 ? 32 : 256;
		if(!d3d::isP8supported){
			tex->raster = readAsImage(stream, width, height, depth, format|type, numLevels);
			return tex;
		}
	}

	Raster *raster;
	D3dRaster *ras;
	if(compression){
		raster = Raster::create(width, height, depth, format | type | Raster::DONTALLOCATE, PLATFORM_D3D8);
		ras = GETD3DRASTEREXT(raster);
		allocateDXT(raster, compression, numLevels, hasAlpha);
		ras->customFormat = 1;
	}else{
		raster = Raster::create(width, height, depth, format | type, PLATFORM_D3D8);
		ras = GETD3DRASTEREXT(raster);
	}
	tex->raster = raster;

	// TODO: check if format supported and convert if necessary

	if(pallength != 0)
		stream->read8(ras->palette, 4*pallength);

	uint32 size;
	uint8 *data;
	for(int32 i = 0; i < numLevels; i++){
		size = stream->readU32();
		if(i < raster->getNumLevels()){
			data = raster->lock(i, Raster::LOCKWRITE|Raster::LOCKNOFETCH);
			stream->read8(data, size);
			raster->unlock(i);
		}else
			stream->seek(size);
	}
	return tex;
}